

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O2

int lws_cache_lookup(lws_cache_ttl_lru *cache,char *wildcard_key,void **pdata,size_t *psize)

{
  lws_cache_ttl_lru *plVar1;
  lws_dll2 *plVar2;
  lws_dll2 *plVar3;
  int iVar4;
  lws_cache_match_t *m;
  lws_cache_ttl_lru *plVar5;
  lws_dll2 **pplVar6;
  uint8_t *ptr;
  uint8_t *puVar7;
  lws_dll2 *plVar8;
  ulong size;
  lws_dll2 *plVar9;
  lws_cache_match_t *m_1;
  lws_dll2 **pplVar10;
  uint8_t *local_f0;
  lws_dll2_owner_t results_owner;
  char meta_key [128];
  
  results_owner.count = 0;
  results_owner._20_4_ = 0;
  results_owner.tail = (lws_dll2 *)0x0;
  results_owner.head = (lws_dll2 *)0x0;
  meta_key[0] = '!';
  lws_strncpy(meta_key + 1,wildcard_key,0x7e);
  iVar4 = (*((cache->info).ops)->get)(cache,meta_key,pdata,psize);
  plVar1 = cache;
  if (iVar4 == 0) {
    return 0;
  }
  do {
    plVar5 = plVar1;
    plVar1 = (plVar5->info).parent;
  } while (plVar1 != (lws_cache_ttl_lru *)0x0);
  iVar4 = (*((plVar5->info).ops)->lookup)(plVar5,wildcard_key,&results_owner);
  if (iVar4 == 0) {
    size = 0;
    plVar9 = (lws_dll2 *)0x0;
    pplVar10 = &results_owner.head;
    pplVar6 = pplVar10;
    while (plVar2 = *pplVar6, plVar2 != (lws_dll2 *)0x0) {
      plVar3 = plVar2[1].prev;
      plVar8 = plVar3;
      if ((long)plVar3 < (long)plVar9) {
        plVar8 = plVar9;
      }
      size = (long)&(plVar2[1].owner)->head + size + 1;
      if (plVar9 == (lws_dll2 *)0x0) {
        plVar8 = plVar3;
      }
      if (plVar3 != (lws_dll2 *)0x0) {
        plVar9 = plVar8;
      }
      pplVar6 = &plVar2->next;
    }
    _lws_log(0x10,"%s: results %d, size %d\n","lws_cache_lookup",results_owner._16_8_ & 0xffffffff,
             size & 0xffffffff);
    ptr = (uint8_t *)lws_realloc((void *)0x0,size,"lws_cache_lookup");
    puVar7 = ptr;
    if (ptr != (uint8_t *)0x0) {
      while (plVar2 = *pplVar10, local_f0 = puVar7, plVar2 != (lws_dll2 *)0x0) {
        lws_ser_wu32be(puVar7,*(uint32_t *)&plVar2[1].next);
        local_f0 = puVar7 + 4;
        lws_ser_wu32be(local_f0,*(uint32_t *)&plVar2[1].owner);
        puVar7 = local_f0;
        memcpy(local_f0 + 4,plVar2 + 2,(size_t)((long)&(plVar2[1].owner)->tail + 1));
        puVar7 = puVar7 + (long)plVar2[1].owner + 5;
        pplVar10 = &plVar2->next;
      }
      lws_cache_clear_matches(&results_owner);
      iVar4 = (*((cache->info).ops)->write)(cache,meta_key,ptr,size,(lws_usec_t)plVar9,&local_f0);
      lws_realloc(ptr,0,"lws_free");
      if (iVar4 != 0) {
        return 1;
      }
      *pdata = local_f0;
      *psize = size;
      return 0;
    }
  }
  else {
    _lws_log(0x10,"%s: bs lookup fail\n","lws_cache_lookup");
  }
  lws_cache_clear_matches(&results_owner);
  return 1;
}

Assistant:

int
lws_cache_lookup(struct lws_cache_ttl_lru *cache, const char *wildcard_key,
		 const void **pdata, size_t *psize)
{
	struct lws_cache_ttl_lru *l1 = cache;
	lws_dll2_owner_t results_owner;
	lws_usec_t expiry = 0;
	char meta_key[128];
	uint8_t *p, *temp;
	size_t sum = 0;
	int n;

	memset(&results_owner, 0, sizeof(results_owner));
	meta_key[0] = META_ITEM_LEADING;
	lws_strncpy(&meta_key[1], wildcard_key, sizeof(meta_key) - 2);

	/*
	 * If we have a cached result set in L1 already, return that
	 */

	if (!l1->info.ops->get(l1, meta_key, pdata, psize))
		return 0;

	/*
	 * No, we have to do the actual lookup work in the backing store layer
	 * to get results for this...
	 */

	while (cache->info.parent)
		cache = cache->info.parent;

	if (cache->info.ops->lookup(cache, wildcard_key, &results_owner)) {
		/* eg, OOM */

		lwsl_cache("%s: bs lookup fail\n", __func__);

		lws_cache_clear_matches(&results_owner);
		return 1;
	}

	/*
	 * Scan the results, we want to know how big a payload it needs in
	 * the cache, and we want to know the earliest expiry of any of the
	 * component parts, so the meta cache entry for these results can be
	 * expired when any of the results would expire.
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, results_owner.head) {
		lws_cache_match_t *m = lws_container_of(d, lws_cache_match_t,
							list);
		sum += 8; /* payload size, name length */
		sum += m->tag_size + 1;

		if (m->expiry && (!expiry || expiry < m->expiry))
			expiry = m->expiry;

	} lws_end_foreach_dll(d);

	lwsl_cache("%s: results %d, size %d\n", __func__,
		    (int)results_owner.count, (int)sum);

	temp = lws_malloc(sum, __func__);
	if (!temp) {
		lws_cache_clear_matches(&results_owner);
		return 1;
	}

	/*
	 * Fill temp with the serialized results
	 */

	p = temp;
	lws_start_foreach_dll(struct lws_dll2 *, d, results_owner.head) {
		lws_cache_match_t *m = lws_container_of(d, lws_cache_match_t,
							list);

		/* we don't copy the payload in, but take note of its size */
		lws_ser_wu32be(p, (uint32_t)m->payload_size);
		p += 4;
		/* length of the tag name (there is an uncounted NUL after) */
		lws_ser_wu32be(p, (uint32_t)m->tag_size);
		p += 4;

		/* then the tag name, plus the extra NUL */
		memcpy(p, &m[1], m->tag_size + 1);
		p += m->tag_size + 1;

	} lws_end_foreach_dll(d);

	lws_cache_clear_matches(&results_owner);

	/*
	 * Create the right amount of space for an L1 record of these results,
	 * with its expiry set to the earliest of the results, and copy it in
	 * from temp
	 */

	n = l1->info.ops->write(l1, meta_key, temp, sum, expiry, (void **)&p);
	/* done with temp */
	lws_free(temp);

	if (n)
		return 1;

	/* point to the results in L1 */

	*pdata = p;
	*psize = sum;

	return 0;
}